

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption> *t)

{
  long lVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)(t->super_RepeatedPtrFieldBase).current_size_;
  if (0 < lVar4) {
    do {
      pvVar2 = ((t->super_RepeatedPtrFieldBase).rep_)->elements[lVar4 + -1];
      uVar5 = (ulong)*(uint *)((long)pvVar2 + 0x20);
      while (0 < (int)uVar5) {
        lVar1 = uVar5 * 8;
        uVar5 = uVar5 - 1;
        if ((~*(uint *)(*(long *)(*(long *)((long)pvVar2 + 0x28) + lVar1) + 0x10) & 3) != 0) {
          return false;
        }
      }
      bVar3 = 1 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar3);
  }
  return true;
}

Assistant:

inline int RepeatedPtrFieldBase::size() const { return current_size_; }